

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O0

void SexMessage(char *from,char *to,int gender,char *victim,char *killer)

{
  char cVar1;
  size_t __n;
  size_t len;
  char *pcStack_38;
  int gendermsg;
  char *subst;
  char *killer_local;
  char *victim_local;
  char *pcStack_18;
  int gender_local;
  char *to_local;
  char *from_local;
  
  pcStack_38 = (char *)0x0;
  pcStack_18 = to;
  to_local = from;
  do {
    if (*to_local == '%') {
      len._4_4_ = -1;
      switch(to_local[1]) {
      case 'g':
        len._4_4_ = 0;
        break;
      case 'h':
        len._4_4_ = 1;
        break;
      case 'k':
        pcStack_38 = killer;
        break;
      case 'o':
        pcStack_38 = victim;
        break;
      case 'p':
        len._4_4_ = 2;
      }
      if (pcStack_38 == (char *)0x0) {
        if (len._4_4_ < 0) {
          *pcStack_18 = '%';
          pcStack_18 = pcStack_18 + 1;
        }
        else {
          strcpy(pcStack_18,SexMessage::genderstuff[gender][len._4_4_]);
          pcStack_18 = pcStack_18 + SexMessage::gendershift[gender][len._4_4_];
          to_local = to_local + 1;
        }
      }
      else {
        __n = strlen(pcStack_38);
        memcpy(pcStack_18,pcStack_38,__n);
        to_local = to_local + 1;
        pcStack_38 = (char *)0x0;
        pcStack_18 = pcStack_18 + __n;
      }
    }
    else {
      *pcStack_18 = *to_local;
      pcStack_18 = pcStack_18 + 1;
    }
    cVar1 = *to_local;
    to_local = to_local + 1;
  } while (cVar1 != '\0');
  return;
}

Assistant:

void SexMessage (const char *from, char *to, int gender, const char *victim, const char *killer)
{
	static const char *genderstuff[3][3] =
	{
		{ "he",  "him", "his" },
		{ "she", "her", "her" },
		{ "it",  "it",  "its" }
	};
	static const int gendershift[3][3] =
	{
		{ 2, 3, 3 },
		{ 3, 3, 3 },
		{ 2, 2, 3 }
	};
	const char *subst = NULL;

	do
	{
		if (*from != '%')
		{
			*to++ = *from;
		}
		else
		{
			int gendermsg = -1;
			
			switch (from[1])
			{
			case 'g':	gendermsg = 0;	break;
			case 'h':	gendermsg = 1;	break;
			case 'p':	gendermsg = 2;	break;
			case 'o':	subst = victim;	break;
			case 'k':	subst = killer;	break;
			}
			if (subst != NULL)
			{
				size_t len = strlen (subst);
				memcpy (to, subst, len);
				to += len;
				from++;
				subst = NULL;
			}
			else if (gendermsg < 0)
			{
				*to++ = '%';
			}
			else
			{
				strcpy (to, genderstuff[gender][gendermsg]);
				to += gendershift[gender][gendermsg];
				from++;
			}
		}
	} while (*from++);
}